

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::ArenaStringPtr::Set(ArenaStringPtr *this,string *value,Arena *arena)

{
  void *pvVar1;
  ArenaStringPtr local_10 [2];
  
  pvVar1 = (this->tagged_ptr_).ptr_;
  if (((ulong)pvVar1 & 3) == 0) {
    NewString<std::__cxx11::string>(this,arena,value);
    return;
  }
  if (((ulong)pvVar1 & 2) == 0) {
    Set(local_10);
  }
  else if ((string *)((ulong)pvVar1 & 0xfffffffffffffffc) != (string *)0x0) {
    std::__cxx11::string::operator=((string *)((ulong)pvVar1 & 0xfffffffffffffffc),(string *)value);
    return;
  }
  Set(local_10);
}

Assistant:

void ArenaStringPtr::Set(std::string&& value, Arena* arena) {
  ScopedCheckPtrInvariants check(&tagged_ptr_);
  if (IsDefault()) {
    NewString(arena, std::move(value));
  } else if (IsFixedSizeArena()) {
    std::string* current = tagged_ptr_.Get();
    auto* s = new (current) std::string(std::move(value));
    arena->OwnDestructor(s);
    tagged_ptr_.SetMutableArena(s);
  } else /* !IsFixedSizeArena() */ {
    *UnsafeMutablePointer() = std::move(value);
  }
}